

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

uint32 Socket::inetAddr(String *addr,uint16 *port)

{
  usize *puVar1;
  usize uVar2;
  ulong uVar3;
  in_addr_t iVar4;
  uint uVar5;
  char *pcVar6;
  ulong length;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  String local_40;
  
  uVar2 = addr->data->len;
  if (0 < (long)uVar2) {
    pcVar8 = addr->data->str;
    pcVar6 = pcVar8 + uVar2;
    pcVar9 = pcVar8;
    do {
      if (*pcVar8 == ':') {
        if (port != (uint16 *)0x0) {
          uVar5 = String::toUInt(pcVar8 + 1);
          *port = (uint16)uVar5;
        }
        pcVar8 = String::operator_cast_to_char_(addr);
        uVar10 = (long)pcVar9 - (long)pcVar8;
        uVar3 = addr->data->len;
        length = uVar3;
        if (uVar10 < uVar3) {
          length = uVar10;
        }
        if ((long)uVar10 < 0) {
          length = uVar3;
        }
        String::String(&local_40,addr->data->str,length);
        pcVar8 = String::operator_cast_to_char_(&local_40);
        iVar4 = inet_addr(pcVar8);
        uVar7 = iVar4 >> 0x18 | (iVar4 & 0xff0000) >> 8 | (iVar4 & 0xff00) << 8 | iVar4 << 0x18;
        if ((local_40.data)->ref == 0) {
          return uVar7;
        }
        LOCK();
        puVar1 = &(local_40.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if (*puVar1 != 0) {
          return uVar7;
        }
        if (local_40.data == (Data *)0x0) {
          return uVar7;
        }
        operator_delete__(local_40.data);
        return uVar7;
      }
      pcVar8 = pcVar8 + 1;
      pcVar9 = pcVar9 + 1;
    } while (pcVar8 < pcVar6);
  }
  pcVar8 = String::operator_cast_to_char_(addr);
  iVar4 = inet_addr(pcVar8);
  return iVar4 >> 0x18 | (iVar4 & 0xff0000) >> 8 | (iVar4 & 0xff00) << 8 | iVar4 << 0x18;
}

Assistant:

uint32 Socket::inetAddr(const String& addr, uint16* port)
{
  const char* portStr = addr.find(':');
  if(portStr)
  {
    if(port)
      *port = (uint16)String::toUInt(portStr + 1);
    return ntohl(inet_addr((const char*)addr.substr(0, (portStr - (const char*)addr))));
  }
  return ntohl(inet_addr((const char*)addr));
}